

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

void __thiscall
skiplist<int,_std::less<int>_>::destroy_all_levels(skiplist<int,_std::less<int>_> *this)

{
  SLNode<int> *pSVar1;
  bool bVar2;
  reference ppSVar3;
  SLNode<int> *local_38;
  SLNode<int> *level;
  iterator __end0;
  iterator __begin0;
  vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_> *__range2;
  SLNode<int> *tmp;
  skiplist<int,_std::less<int>_> *this_local;
  
  __end0 = std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::begin(&this->key);
  level = (SLNode<int> *)std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::end(&this->key)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<SLNode<int>_**,_std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>_>
                                     *)&level), bVar2) {
    ppSVar3 = __gnu_cxx::
              __normal_iterator<SLNode<int>_**,_std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>_>
              ::operator*(&__end0);
    pSVar1 = *ppSVar3;
    while (local_38 = pSVar1, local_38 != (SLNode<int> *)0x0) {
      pSVar1 = local_38->next;
      if (local_38 != (SLNode<int> *)0x0) {
        SLNode<int>::~SLNode(local_38);
        operator_delete(local_38);
      }
    }
    __gnu_cxx::
    __normal_iterator<SLNode<int>_**,_std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>_>::
    operator++(&__end0);
  }
  std::vector<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>::clear(&this->key);
  return;
}

Assistant:

void destroy_all_levels() {
        SLNode<val_type> *tmp;
        for(auto level: key)
            while(level) {
                tmp = level->next;
                delete level;
                level = tmp;
            }
        key.clear();
    }